

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

vector<int,_std::allocator<int>_> *
JSON::parseIntArray(vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *json)

{
  char cVar1;
  size_type sVar2;
  int iVar3;
  int i;
  long lVar4;
  int curid;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (*(json->_M_dataplus)._M_p == '[') {
    sVar2 = json->_M_string_length;
    curid = 0;
    iVar3 = 0;
    for (lVar4 = 1; lVar4 < (int)sVar2; lVar4 = lVar4 + 1) {
      cVar1 = (json->_M_dataplus)._M_p[lVar4];
      if (cVar1 != ' ') {
        if (cVar1 == ',') {
          std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&curid);
          curid = 0;
          iVar3 = 0;
        }
        else {
          if (cVar1 == ']') {
            std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&curid);
            return __return_storage_ptr__;
          }
          iVar3 = iVar3 * 10 + (int)cVar1 + -0x30;
          curid = iVar3;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> parseIntArray(const std::string & json) {
    std::vector<int> res;
    if (json[0] != '[') return res;

    int n = json.size();
    int curid = 0;
    for (int i = 1; i < n; ++i) {
        if (json[i] == ' ') continue;
        if (json[i] == ',') {
            res.push_back(curid);
            curid = 0;
            continue;
        }

        if (json[i] == ']') {
            res.push_back(curid);
            break;
        }

        curid = 10*curid + json[i] - 48;
    }

    return res;
}